

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int btreeInvokeBusyHandler(void *pArg)

{
  long lVar1;
  int iVar2;
  sqlite3_file *pFile;
  BtShared *pBt;
  void *pArg_local;
  
  lVar1 = *(long *)((long)pArg + 8);
  pFile = sqlite3PagerFile(*pArg);
  iVar2 = sqlite3InvokeBusyHandler((BusyHandler *)(lVar1 + 0x228),pFile);
  return iVar2;
}

Assistant:

static int btreeInvokeBusyHandler(void *pArg){
  BtShared *pBt = (BtShared*)pArg;
  assert( pBt->db );
  assert( sqlite3_mutex_held(pBt->db->mutex) );
  return sqlite3InvokeBusyHandler(&pBt->db->busyHandler,
                                  sqlite3PagerFile(pBt->pPager));
}